

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_filter.cpp
# Opt level: O0

void __thiscall
ParticleFilter::updateWeights
          (ParticleFilter *this,double sensor_range,double *std_landmark,
          vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations,Map *map_landmarks)

{
  float fVar1;
  double x1;
  double y1;
  int iVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double denominator;
  double numerator;
  double num_b;
  double num_a;
  double delta_angle;
  double delta_length;
  double m_angle;
  double m_length;
  double o_angle;
  double o_length;
  double m_y_2;
  double m_x_2;
  int map_index;
  double o_y_1;
  double o_x_1;
  double dStack_150;
  int j_2;
  double new_weight;
  undefined1 local_130 [8];
  LandmarkObs l_1;
  double m_y_1;
  double m_x_1;
  double o_y;
  double o_x;
  int index_1;
  int j_1;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> observations_in_map_coordinates;
  LandmarkObs l;
  double m_y;
  double m_x;
  int index;
  int j;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> map_landmarks_in_range;
  double p_theta;
  double p_y;
  double p_x;
  undefined1 local_60 [4];
  int i;
  vector<double,_std::allocator<double>_> new_weights;
  vector<Particle,_std::allocator<Particle>_> new_particles;
  Map *map_landmarks_local;
  vector<LandmarkObs,_std::allocator<LandmarkObs>_> *observations_local;
  double *std_landmark_local;
  double sensor_range_local;
  ParticleFilter *this_local;
  
  std::vector<Particle,_std::allocator<Particle>_>::vector
            ((vector<Particle,_std::allocator<Particle>_> *)
             &new_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  p_x._4_4_ = 0;
  while( true ) {
    sVar3 = std::vector<Particle,_std::allocator<Particle>_>::size(&this->particles);
    if (sVar3 <= (ulong)(long)p_x._4_4_) break;
    pvVar4 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(long)p_x._4_4_);
    x1 = pvVar4->x;
    pvVar4 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(long)p_x._4_4_);
    y1 = pvVar4->y;
    pvVar4 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(long)p_x._4_4_);
    map_landmarks_in_range.super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pvVar4->theta;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index);
    m_x._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::size
                        (&map_landmarks->landmark_list);
      if (sVar3 <= (ulong)(long)m_x._4_4_) break;
      pvVar5 = std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::
               operator[](&map_landmarks->landmark_list,(long)m_x._4_4_);
      iVar2 = pvVar5->id_i;
      pvVar5 = std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::
               operator[](&map_landmarks->landmark_list,(long)m_x._4_4_);
      fVar1 = pvVar5->x_f;
      pvVar5 = std::vector<Map::single_landmark_s,_std::allocator<Map::single_landmark_s>_>::
               operator[](&map_landmarks->landmark_list,(long)m_x._4_4_);
      dVar8 = dist(x1,y1,(double)fVar1,(double)pvVar5->y_f);
      if (dVar8 < sensor_range) {
        observations_in_map_coordinates.
        super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = iVar2;
        std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                  ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index,
                   (value_type *)
                   &observations_in_map_coordinates.
                    super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      m_x._4_4_ = m_x._4_4_ + 1;
    }
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1);
    o_x._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size(observations);
      if (sVar3 <= (ulong)(long)o_x._4_4_) break;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         (observations,(long)o_x._4_4_);
      iVar2 = pvVar6->id;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         (observations,(long)o_x._4_4_);
      dVar8 = pvVar6->x;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         (observations,(long)o_x._4_4_);
      dVar13 = pvVar6->y;
      dVar9 = cos((double)map_landmarks_in_range.
                          super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
      dVar10 = sin((double)map_landmarks_in_range.
                           super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      dVar11 = sin((double)map_landmarks_in_range.
                           super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      dVar12 = cos((double)map_landmarks_in_range.
                           super__Vector_base<LandmarkObs,_std::allocator<LandmarkObs>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage);
      l_1.x = dVar13 * dVar12 + dVar8 * dVar11 + y1;
      local_130._0_4_ = iVar2;
      l_1._0_8_ = (dVar8 * dVar9 + x1) - dVar13 * dVar10;
      l_1.y = l_1.x;
      std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::push_back
                ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1,
                 (value_type *)local_130);
      o_x._4_4_ = o_x._4_4_ + 1;
    }
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&new_weight,
               (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index);
    dataAssociation(this,(vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&new_weight,
                    (vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1);
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&new_weight);
    dStack_150 = 1.0;
    o_x_1._4_4_ = 0;
    while( true ) {
      sVar3 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::size
                        ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1);
      if (sVar3 <= (ulong)(long)o_x_1._4_4_) break;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1,
                          (long)o_x_1._4_4_);
      dVar8 = pvVar6->x - x1;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1,
                          (long)o_x_1._4_4_);
      dVar13 = pvVar6->y - y1;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1,
                          (long)o_x_1._4_4_);
      iVar2 = pvVar6->id;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index,(long)iVar2);
      dVar9 = pvVar6->x - x1;
      pvVar6 = std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::operator[]
                         ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index,(long)iVar2);
      dVar10 = pvVar6->y - y1;
      dVar11 = sqrt(dVar8 * dVar8 + dVar13 * dVar13);
      dVar8 = atan2(dVar13,dVar8);
      dVar13 = sqrt(dVar9 * dVar9 + dVar10 * dVar10);
      dVar9 = atan2(dVar10,dVar9);
      dStack_150 = exp((((dVar11 - dVar13) * (dVar11 - dVar13)) /
                        (*std_landmark * 2.0 * *std_landmark) +
                       ((dVar8 - dVar9) * (dVar8 - dVar9)) /
                       (std_landmark[1] * 2.0 * std_landmark[1])) * -1.0);
      dStack_150 = dStack_150 / (*std_landmark * 6.283185307179586 * std_landmark[1]);
      o_x_1._4_4_ = o_x_1._4_4_ + 1;
    }
    pvVar4 = std::vector<Particle,_std::allocator<Particle>_>::operator[]
                       (&this->particles,(long)p_x._4_4_);
    pvVar4->weight = dStack_150;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->weights,(long)p_x._4_4_);
    *pvVar7 = dStack_150;
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index_1);
    std::vector<LandmarkObs,_std::allocator<LandmarkObs>_>::~vector
              ((vector<LandmarkObs,_std::allocator<LandmarkObs>_> *)&index);
    p_x._4_4_ = p_x._4_4_ + 1;
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<Particle,_std::allocator<Particle>_>::~vector
            ((vector<Particle,_std::allocator<Particle>_> *)
             &new_weights.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void ParticleFilter::updateWeights(double sensor_range, double std_landmark[], std::vector<LandmarkObs> observations, Map map_landmarks) {
  std::vector<Particle> new_particles;
  std::vector<double> new_weights;
  for (int i=0; i<particles.size(); i++)
  {
    double p_x = particles[i].x;
    double p_y = particles[i].y;
    double p_theta = particles[i].theta;

    // Find map landmarks within the sensor range of the particle
    std::vector<LandmarkObs> map_landmarks_in_range;
    for (int j=0; j<map_landmarks.landmark_list.size(); j++)
    {
      int index = map_landmarks.landmark_list[j].id_i;
      double m_x = map_landmarks.landmark_list[j].x_f;
      double m_y = map_landmarks.landmark_list[j].y_f;
      if (dist(p_x, p_y, m_x, m_y) < sensor_range)
      {
        LandmarkObs l = {index, m_x, m_y};
        map_landmarks_in_range.push_back(l); 
      }
    }

    // Change observation coordinates to map coordinates
    std::vector<LandmarkObs> observations_in_map_coordinates;
    for (int j=0; j<observations.size(); j++)
    {
      int index = observations[j].id;
      double o_x = observations[j].x;
      double o_y = observations[j].y;
      double m_x = p_x + o_x * cos(p_theta) - o_y * sin(p_theta);
      double m_y = p_y + o_x * sin(p_theta) + o_y * cos(p_theta); 
      LandmarkObs l = {index, m_x, m_y};
      observations_in_map_coordinates.push_back(l); 
    }

    // Use the data association method 
    dataAssociation(map_landmarks_in_range, observations_in_map_coordinates);

    // Compute the new weight based on two vectors from point to observation and landmark
    double new_weight = 1.0; 
    for (int j=0; j<observations_in_map_coordinates.size(); j++)
    {
      double o_x = observations_in_map_coordinates[j].x - p_x;
      double o_y = observations_in_map_coordinates[j].y - p_y;
      int map_index = observations_in_map_coordinates[j].id;
      double m_x = map_landmarks_in_range[map_index].x - p_x;
      double m_y = map_landmarks_in_range[map_index].y - p_y;
      double o_length = sqrt(o_x * o_x + o_y * o_y);
      double o_angle = atan2(o_y, o_x);
      double m_length = sqrt(m_x * m_x + m_y * m_y);
      double m_angle = atan2(m_y, m_x);
      double delta_length = o_length - m_length;
      double delta_angle = o_angle - m_angle; 	

      // Bivariate Gaussian
      double num_a = delta_length * delta_length / (2.0 * std_landmark[0] * std_landmark[0]);
      double num_b = delta_angle * delta_angle / (2.0 * std_landmark[1] * std_landmark[1]);
      double numerator = exp(-1.0 * (num_a + num_b));
      double denominator = 2.0 * M_PI * std_landmark[0] * std_landmark[1];
      new_weight = numerator / denominator;
    } 
    particles[i].weight = new_weight;
    weights[i] = new_weight;
  }
}